

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stpncpy_s.c
# Opt level: O2

char * stpncpy_s(char *dest,rsize_t dmax,char *src,rsize_t smax,errno_t *err)

{
  long lVar1;
  rsize_t rVar2;
  long lVar3;
  char *msg;
  char cVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    pcVar5 = (char *)0x0;
    invoke_safe_str_constraint_handler("stpncpy_s: dest is null",(void *)0x0,400);
    *err = 400;
    goto LAB_001043c5;
  }
  if (src == (char *)0x0) {
    invoke_safe_str_constraint_handler("stpncpy_s: src is null",(void *)0x0,400);
    *err = 400;
LAB_0010437c:
    pcVar5 = (char *)0x0;
    *dest = '\0';
  }
  else {
    if (dmax == 0) {
      pcVar5 = (char *)0x0;
      invoke_safe_str_constraint_handler("stpncpy_s: dmax is 0",(void *)0x0,0x191);
      *err = 0x191;
      goto LAB_001043c5;
    }
    if (dmax < 0x10000001) {
      if (smax < 0x10000001) {
        if (smax < dmax) {
          if (src + smax < dest || dest <= src) {
            if (dest + smax < src || src <= dest) {
              if (dest == src) {
                rVar2 = 0;
LAB_0010449c:
                if (dmax != rVar2) {
                  if (dest[rVar2] != '\0') goto code_r0x001044a8;
                  for (lVar3 = 0; smax - rVar2 != lVar3; lVar3 = lVar3 + 1) {
                    dest[rVar2 + lVar3] = '\0';
                  }
                  goto LAB_00104510;
                }
                goto LAB_001044b8;
              }
              for (rVar2 = 0; dmax != rVar2; rVar2 = rVar2 + 1) {
                cVar4 = src[rVar2];
                if (smax == rVar2) {
                  cVar4 = '\0';
                }
                dest[rVar2] = cVar4;
                if (cVar4 == '\0') {
                  for (lVar3 = 0; smax - rVar2 != lVar3; lVar3 = lVar3 + 1) {
                    dest[rVar2 + lVar3] = '\0';
                  }
LAB_00104510:
                  pcVar5 = dest + rVar2;
                  *err = 0;
                  goto LAB_001043c5;
                }
              }
LAB_001044b8:
              *dest = '\0';
              pcVar5 = (char *)0x0;
              invoke_safe_str_constraint_handler
                        ("stpncpy_s: not enough space for src",(void *)0x0,0x196);
              *err = 0x196;
              goto LAB_001043c5;
            }
            pcVar5 = "stpncpy_s: dest+smax overlaps into src";
          }
          else {
            pcVar5 = "stpncpy_s: src+smax overlaps into dest";
          }
          invoke_safe_str_constraint_handler(pcVar5,(void *)0x0,0x194);
          *err = 0x194;
        }
        else {
          invoke_safe_str_constraint_handler("stpncpy_s: dmax too short for smax",(void *)0x0,0x196)
          ;
          *err = 0x196;
        }
        goto LAB_0010437c;
      }
      msg = "stpncpy_s: smax exceeds max";
    }
    else {
      msg = "stpncpy_s: dmax exceeds max";
    }
    pcVar5 = (char *)0x0;
    invoke_safe_str_constraint_handler(msg,(void *)0x0,0x193);
    *err = 0x193;
  }
LAB_001043c5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pcVar5;
  }
  __stack_chk_fail();
code_r0x001044a8:
  if (smax - 1 == rVar2) {
    dest[rVar2 + 1] = '\0';
  }
  rVar2 = rVar2 + 1;
  goto LAB_0010449c;
}

Assistant:

char *
stpncpy_s(char *dest, rsize_t dmax, const char *src, rsize_t smax, errno_t *err)
{
    rsize_t orig_dmax;
    char *orig_dest;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("stpncpy_s: dest is null",
                   NULL, ESNULLP);
        *err = RCNEGATE(ESNULLP);
        return NULL;
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("stpncpy_s: src is null",
                   NULL, ESNULLP);
        *err = RCNEGATE(ESNULLP);
        dest[0] = '\0';
        return NULL;
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("stpncpy_s: dmax is 0",
                   NULL, ESZEROL);
        *err = RCNEGATE(ESZEROL);
        return NULL;
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("stpncpy_s: dmax exceeds max",
                   NULL, ESLEMAX);
        *err = RCNEGATE(ESLEMAX);
        return NULL;
    }

    if (smax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("stpncpy_s: smax exceeds max",
                   NULL, ESLEMAX);
        *err = RCNEGATE(ESLEMAX);
        return NULL;
    }

    if (dmax < (smax+1)) {
        invoke_safe_str_constraint_handler("stpncpy_s: dmax too short for smax",
                   NULL, ESNOSPC);
        *err = RCNEGATE(ESNOSPC);
        dest[0] = '\0';
        return NULL;
    }

    /* dmwheel1: Add check to prevent destruction of overlap into destination */
    if ((src < dest) && ((src+smax) >= dest)) {
        invoke_safe_str_constraint_handler("stpncpy_s: src+smax overlaps into dest",
                   NULL, ESOVRLP);
        *err = RCNEGATE(ESOVRLP);
        dest[0] = '\0';
        return NULL;
    }

    /* dmwheel1: Add check to prevent destruction of overlap into source */
    if ((dest < src) && ((dest+smax) >= src)) {
        invoke_safe_str_constraint_handler("stpncpy_s: dest+smax overlaps into src",
                   NULL, ESOVRLP);
        *err = RCNEGATE(ESOVRLP);
        dest[0] = '\0';
        return NULL;
    }

#ifdef SAFECLIB_STR_NULL_SLACK
    /* dmwheel1: Add check to prevent destruction of overlap into destination */
    if ((src < dest) && ((src+dmax) >= dest)) {
        invoke_safe_str_constraint_handler("stpncpy_s: src+dmax overlaps into dest",
                   NULL, ESOVRLP);
        *err = RCNEGATE(ESOVRLP);
        return NULL;
    }

    /* dmwheel1: Add check to prevent destruction of overlap into source */
    if ((dest < src) && ((dest+dmax) >= src)) {
        invoke_safe_str_constraint_handler("stpncpy_s: dest+dmax overlaps into src",
                   NULL, ESOVRLP);
        *err = RCNEGATE(ESOVRLP);
        return NULL;
    }
#endif


    if (src == NULL) {
#ifdef SAFECLIB_STR_NULL_SLACK
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }
#else
        *dest = '\0';
#endif
        invoke_safe_str_constraint_handler("stpncpy_s: src is null",
                   NULL, ESNULLP);
        *err = RCNEGATE(ESNULLP);
        return NULL;
    }

    /* hold base of dest in case src was not copied */
    orig_dmax = dmax;
    orig_dest = dest;

    if (dest == src) {
        /* look for the terminating null character, or return err if not found in dmax bytes */
        while (dmax > 0) {
            if (*dest == '\0') {
                /* add nulls to complete smax */
                char *filler = dest; /* don't change dest, because we need to return it */
                while (smax) { *filler = '\0'; dmax--; smax--; filler++; }
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null dmax slack to clear any data */
                while (dmax) { *filler = '\0'; dmax--; filler++; }
#endif
                *err = RCNEGATE(EOK);
                return dest;
            }
            dmax--;
            dest++;
            if (--smax == 0) {
                /* we have copied smax characters, add null terminator */
                *dest = '\0';
            }
        }
        /* null terminator not found in src before end of dmax */
        handle_error(orig_dest, orig_dmax, "stpncpy_s: not enough space for src",
                         ESNOSPC);
        *err = RCNEGATE(ESNOSPC);
        return NULL;
    }


    /* All checks for buffer overlaps were made, just do the copies */
    while (dmax > 0) {

        *dest = *src; /* Copy the data into the destination */

        /* Check for maximum copy from source */
        if (smax == 0) {
            /* we have copied smax characters, add null terminator */
            *dest = '\0';
        }

        /* Check for end of copying */
        if (*dest == '\0') {
            /* add nulls to complete smax, if fewer than smax characters
             * were in src when the NULL was encountered */
            char *filler = dest; /* don't change dest, because we need to return it */
            while (smax) { *filler = '\0'; dmax--; smax--; filler++; }
#ifdef SAFECLIB_STR_NULL_SLACK
            /* null dmax slack to clear any data */
            while (dmax) { *filler = '\0'; dmax--; filler++; }
#endif
            *err = RCNEGATE(EOK);
            return dest;
        }
        dmax--;
        smax--;
        dest++;
        src++;

    }
    /*
     * Ran out of space in dest, and did not find the null terminator in src
     */
    handle_error(orig_dest, orig_dmax, "stpncpy_s: not enough space for src",
                 ESNOSPC);
    *err = RCNEGATE(ESNOSPC);
    return NULL;
}